

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

complex<double> * c8mat_test_inverse(int n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  complex<double> *pcVar5;
  ulong *puVar6;
  long lVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  
  uVar4 = (ulong)(uint)n;
  pcVar5 = c8mat_test(n);
  if (0 < n) {
    puVar6 = (ulong *)(pcVar5->_M_value + 8);
    lVar7 = 0;
    uVar9 = 0;
    puVar8 = puVar6;
    do {
      if (uVar9 != 0) {
        lVar11 = 0;
        puVar10 = puVar6;
        do {
          uVar1 = *(ulong *)((long)puVar8 + lVar11 + -8);
          uVar2 = *(ulong *)((long)puVar8 + lVar11);
          uVar3 = *puVar10;
          *(ulong *)((long)puVar8 + lVar11 + -8) = puVar10[-1];
          *(ulong *)((long)puVar8 + lVar11) = uVar3 ^ 0x8000000000000000;
          puVar10[-1] = uVar1;
          *puVar10 = uVar2 ^ 0x8000000000000000;
          lVar11 = lVar11 + 0x10;
          puVar10 = puVar10 + uVar4 * 2;
        } while (lVar7 != lVar11);
      }
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + uVar4 * 2;
      puVar6 = puVar6 + 2;
      lVar7 = lVar7 + 0x10;
    } while (uVar9 != uVar4);
  }
  return pcVar5;
}

Assistant:

complex <double> *c8mat_test_inverse ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_TEST_INVERSE returns the inverse of a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Output, complex <double> C8MAT_TEST_INVERSE[N*N], the matrix.
//
{
  complex <double> *a;
  int i;
  int j;
  complex <double> t;

  a = c8mat_test ( n );

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < j; i++ )
    {
      t        = conj ( a[i+j*n] );
      a[i+j*n] = conj ( a[j+i*n] );
      a[j+i*n] = t;
    }
  }
  return a;
}